

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

ssize_t __thiscall diffusion::NetReader::read(NetReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  allocator_type local_1a;
  undefined1 local_19;
  undefined8 *local_18;
  NetReader *this_local;
  vector<char,_std::allocator<char>_> *data;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_18 = puVar2;
  this_local = this;
  uVar1 = (**(code **)*puVar2)();
  if ((uVar1 & 1) != 0) {
    local_19 = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)this,0,&local_1a);
    std::allocator<char>::~allocator(&local_1a);
    Tokenizer::pop((Tokenizer *)(puVar2 + 4),(vector<char,_std::allocator<char>_> *)this);
    return (ssize_t)this;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,ErrorNoData::~ErrorNoData);
}

Assistant:

std::vector<char> NetReader::read() {
    if (this->can_read()) {
        // Assuming single thread.
        std::vector<char> data(0);
        data_queue_.pop(data);
        return data;
    } else {
        throw ErrorNoData();
    }
}